

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::closeBeamlet_abi_cxx11_(Station *this,int beam,int aperture,bool lside)

{
  bool bVar1;
  pair<int,_int> pVar2;
  reference pvVar3;
  reference pvVar4;
  int in_ECX;
  long in_RSI;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_RDI;
  byte in_R8B;
  pair<int,_double> pVar5;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> pVar6;
  int i_1;
  int i;
  int row;
  pair<int,_int> coord;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff;
  type in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  Station *in_stack_fffffffffffffe98;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffea0;
  pair<int,_int> in_stack_fffffffffffffea8;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffeb0;
  pair<int,_int> in_stack_fffffffffffffec8;
  pair<int,_int> in_stack_fffffffffffffed0;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  undefined8 in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  int local_7c;
  int local_3c;
  int local_34;
  int iStack_30;
  
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x13aa51);
  bVar1 = isActiveBeamlet(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
  if ((bVar1) &&
     (bVar1 = isOpenBeamlet(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                            in_stack_fffffffffffffe90), bVar1)) {
    pVar2 = Collimator::indexToPos
                      ((Collimator *)CONCAT17(bVar1,in_stack_ffffffffffffff08),
                       (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       (int)in_stack_ffffffffffffff00);
    local_34 = pVar2.first;
    iStack_30 = pVar2.second;
    if ((in_R8B & 1) == 0) {
      local_7c = 0;
      while( true ) {
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_34);
        if (pvVar4->second - iStack_30 < local_7c) break;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_ECX);
        pVar5 = std::make_pair<int,double>
                          ((int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           (double *)in_stack_fffffffffffffe88);
        in_stack_fffffffffffffeb0 =
             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)pVar5.second;
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        push_back(in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98);
        local_7c = local_7c + 1;
      }
      in_stack_fffffffffffffea8 =
           std::make_pair<int&,int&>((int *)in_stack_fffffffffffffe88,(int *)0x13af11);
      pvVar3 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_ECX);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                (pvVar3,(long)local_34);
      std::make_pair<std::pair<int,int>,std::pair<int,int>&>
                ((pair<int,_int> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 &in_stack_fffffffffffffe88->first);
      std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::operator=
                ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88);
      pvVar3 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_ECX);
      pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar3,(long)local_34);
      if (pvVar4->first == iStack_30) {
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_34);
        pvVar4->first = -1;
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_34);
        pvVar4->second = -1;
      }
      else {
        iStack_30 = iStack_30 + -1;
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_34);
        pvVar4->second = iStack_30;
      }
      pVar6.second = in_stack_fffffffffffffec8;
      pVar6.first = in_stack_fffffffffffffed0;
    }
    else {
      local_3c = 0;
      while( true ) {
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_34);
        if (iStack_30 - pvVar4->first < local_3c) break;
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                  (pvVar3,(long)local_34);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_ECX);
        pVar5 = std::make_pair<int,double>
                          ((int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           (double *)in_stack_fffffffffffffe88);
        in_stack_fffffffffffffee8 =
             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)pVar5.second;
        in_stack_fffffffffffffef4 = pVar5.first;
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        push_back(in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98);
        local_3c = local_3c + 1;
      }
      std::make_pair<int&,int&>((int *)in_stack_fffffffffffffe88,(int *)0x13ac8b);
      pvVar3 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_ECX);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                (pvVar3,(long)local_34);
      pVar6 = std::make_pair<std::pair<int,int>,std::pair<int,int>&>
                        ((pair<int,_int> *)
                         CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         &in_stack_fffffffffffffe88->first);
      std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::operator=
                ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88);
      pvVar3 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_ECX);
      pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar3,(long)local_34);
      if (pvVar4->second == iStack_30) {
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_34);
        pvVar4->first = -1;
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_34);
        pvVar4->second = -1;
      }
      else {
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_34);
        pvVar4->first = iStack_30 + 1;
      }
    }
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)pVar6.first
               ,(list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                pVar6.second);
    updateIntensity((Station *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                    in_stack_fffffffffffffee8);
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x13b0ad);
  }
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            (in_stack_fffffffffffffeb0,
             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             in_stack_fffffffffffffea8);
  return in_RDI;
}

Assistant:

list<pair <int,double> > Station::closeBeamlet(int beam, int aperture, bool lside) {
    
    list<pair <int, double> > diff;
    //cout << "Attempt to close beam: " << beam << " from left? " << lside << endl;
    //cout << "active: " << isActiveBeamlet(beam) << "open: " << isOpenBeamlet(beam, aperture) << endl;

    if (isActiveBeamlet(beam) && isOpenBeamlet(beam, aperture)) {
      auto coord = collimator.indexToPos(beam, angle);
      int row= coord.first;
      //cout << "Coordinates: " << coord.first << "," << coord.second << endl;
      if (lside) {
        //cout << "lside" << endl;
        for (int i=0;i<=coord.second-A[aperture][row].first;i++) {
          diff.push_back(make_pair(beam-(coord.second-A[aperture][row].first)+i, -intensity[aperture]));
          //cout << "el diff es " << beam-(coord.second-A[aperture][row].first)+i <<"," << -intensity[aperture] << endl; 
        }
        last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
        if (A[aperture][row].second == coord.second) {
          A[aperture][row].first = -1;
          A[aperture][row].second = -1;
        } else {
          A[aperture][row].first = coord.second+1;
        }
      } else {
        for (int i=0;i<=A[aperture][row].second-coord.second;i++) {
          diff.push_back(make_pair(beam+i, -intensity[aperture]));
	      }
        last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
	      if (A[aperture][row].first == coord.second) {
	        A[aperture][row].first=-1;
	        A[aperture][row].second=-1;
	      } else {
          A[aperture][row].second=coord.second-1;
        }
      }
      updateIntensity(diff);
    }
    last_diff=diff;
    return(diff);
  }